

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall
sector_t::NextHighestCeilingAt
          (sector_t *this,double x,double y,double bottomz,double topz,int flags,
          sector_t **resultsec,F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  secplane_t *psVar2;
  bool bVar3;
  subsector_t *psVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double in_XMM12_Qa;
  
  dVar12 = -3.4028234663852886e+38;
  do {
    dVar11 = ((this->ceilingplane).normal.Y * y +
             (this->ceilingplane).normal.X * x + (this->ceilingplane).D) *
             (this->ceilingplane).negiC;
    uVar5 = (this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count - 1;
    iVar8 = 4;
    if (-1 < (int)uVar5) {
      lVar6 = (ulong)uVar5 + 1;
      do {
        pFVar1 = (this->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar6 + -1];
        iVar8 = 6;
        if ((~pFVar1->flags & 3) == 0) {
          psVar2 = (pFVar1->bottom).plane;
          dVar10 = ((psVar2->normal).Y * y + (psVar2->normal).X * x + psVar2->D) * psVar2->negiC;
          iVar8 = 0;
          if ((dVar10 < dVar11) &&
             (psVar2 = (pFVar1->top).plane,
             dVar9 = (((psVar2->normal).Y * y + (psVar2->normal).X * x + psVar2->D) * psVar2->negiC
                     - dVar10) * 0.5 + dVar10, ABS(topz - dVar9) < ABS(bottomz - dVar9))) {
            if (resultsec != (sector_t **)0x0) {
              *resultsec = this;
            }
            iVar8 = 1;
            in_XMM12_Qa = dVar10;
            if (resultffloor != (F3DFloor **)0x0) {
              *resultffloor = pFVar1;
            }
          }
        }
      } while (((iVar8 == 6) || (iVar8 == 0)) &&
              (lVar7 = lVar6 + -1, bVar3 = 0 < lVar6, lVar6 = lVar7, iVar8 = 4, lVar7 != 0 && bVar3)
              );
    }
    if (iVar8 == 4) {
      if (((flags & 0x10U) == 0) && ((this->planes[1].Flags & 0x1d0U) == 0x100)) {
        uVar5 = this->Portals[1];
        dVar10 = sectorPortals.Array[uVar5].mPlaneZ;
        if (dVar12 < dVar10) {
          x = x + sectorPortals.Array[uVar5].mDisplacement.X;
          y = y + sectorPortals.Array[uVar5].mDisplacement.Y;
          psVar4 = P_PointInSubsector(x,y);
          this = psVar4->sector;
          iVar8 = 0;
          dVar12 = dVar10;
          goto LAB_00536120;
        }
      }
      if (resultffloor != (F3DFloor **)0x0) {
        *resultffloor = (F3DFloor *)0x0;
      }
      iVar8 = 1;
      in_XMM12_Qa = dVar11;
      if (resultsec != (sector_t **)0x0) {
        *resultsec = this;
      }
    }
LAB_00536120:
    if (iVar8 != 0) {
      return in_XMM12_Qa;
    }
  } while( true );
}

Assistant:

double sector_t::NextHighestCeilingAt(double x, double y, double bottomz, double topz, int flags, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = -FLT_MAX;

	while (true)
	{
		// Looking through planes from bottom to top
		double realceil = sec->ceilingplane.ZatPoint(x, y);
		for (int i = sec->e->XFloor.ffloors.Size() - 1; i >= 0; --i)
		{
			F3DFloor *rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(x, y);
			double ff_top = rover->top.plane->ZatPoint(x, y);

			double delta1 = bottomz - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = topz - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_bottom < realceil && fabs(delta1) > fabs(delta2))
			{ 
				if (resultsec) *resultsec = sec;
				if (resultffloor) *resultffloor = rover;
				return ff_bottom;
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(ceiling) || planeheight >= sec->GetPortalPlaneZ(ceiling))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realceil;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(ceiling);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(ceiling);
			sec = P_PointInSector(x, y);
		}
	}
}